

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_void_cookie_t
xcb_input_change_device_property_checked
          (xcb_connection_t *c,xcb_atom_t property,xcb_atom_t type,uint8_t device_id,uint8_t format,
          uint8_t mode,uint32_t num_items,void *items)

{
  int iVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  uint32_t in_ESI;
  undefined8 in_RDI;
  undefined1 in_R8B;
  undefined1 in_R9B;
  long in_FS_OFFSET;
  xcb_input_change_device_property_request_t xcb_out;
  xcb_void_cookie_t xcb_ret;
  iovec xcb_parts [5];
  undefined4 **_buffer;
  undefined4 local_78;
  uint32_t uStack_74;
  undefined8 uStack_70;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long lStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lStack_10 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  _buffer = &local_38;
  local_5c = 0xaaaaaaaa;
  _local_78 = CONCAT44(in_ESI,0xaaaaaaaa);
  uStack_70 = (ulong)CONCAT16(in_R9B,CONCAT15(in_R8B,CONCAT14(in_CL,in_EDX)));
  local_38 = &local_78;
  uStack_30 = 0x14;
  local_28 = 0;
  uStack_20 = 0;
  iVar1 = xcb_input_change_device_property_items_sizeof
                    (_buffer,in_ESI,(uint8_t)((uint)in_EDX >> 0x18));
  lStack_10 = (long)iVar1;
  local_5c = xcb_send_request(in_RDI,1,_buffer,&xcb_input_change_device_property_checked::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_void_cookie_t)local_5c;
  }
  __stack_chk_fail();
}

Assistant:

xcb_void_cookie_t
xcb_input_change_device_property_checked (xcb_connection_t *c,
                                          xcb_atom_t        property,
                                          xcb_atom_t        type,
                                          uint8_t           device_id,
                                          uint8_t           format,
                                          uint8_t           mode,
                                          uint32_t          num_items,
                                          const void       *items)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 3,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_CHANGE_DEVICE_PROPERTY,
        .isvoid = 1
    };

    struct iovec xcb_parts[5];
    xcb_void_cookie_t xcb_ret;
    xcb_input_change_device_property_request_t xcb_out;

    xcb_out.property = property;
    xcb_out.type = type;
    xcb_out.device_id = device_id;
    xcb_out.format = format;
    xcb_out.mode = mode;
    xcb_out.pad0 = 0;
    xcb_out.num_items = num_items;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;
    /* xcb_input_change_device_property_items_t items */
    xcb_parts[4].iov_base = (char *) items;
    xcb_parts[4].iov_len =
      xcb_input_change_device_property_items_sizeof (items, num_items, format);

    xcb_ret.sequence = xcb_send_request(c, XCB_REQUEST_CHECKED, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}